

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::TZGNCore::getGenericLocationName
          (TZGNCore *this,UnicodeString *tzCanonicalID,UnicodeString *name)

{
  short sVar1;
  int32_t srcLength;
  UChar *s;
  int32_t length;
  
  if (0x1f < (ushort)(tzCanonicalID->fUnion).fStackFields.fLengthAndFlags) {
    umtx_lock_63((UMutex *)gLock);
    s = getGenericLocationName(this,tzCanonicalID);
    umtx_unlock_63((UMutex *)gLock);
    if (s != (UChar *)0x0) {
      srcLength = u_strlen_63(s);
      UnicodeString::unBogus(name);
      sVar1 = (name->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        length = (name->fUnion).fFields.fLength;
      }
      else {
        length = (int)sVar1 >> 5;
      }
      UnicodeString::doReplace(name,0,length,s,0,srcLength);
      return name;
    }
  }
  UnicodeString::setToBogus(name);
  return name;
}

Assistant:

UnicodeString&
TZGNCore::getGenericLocationName(const UnicodeString& tzCanonicalID, UnicodeString& name) const {
    if (tzCanonicalID.isEmpty()) {
        name.setToBogus();
        return name;
    }

    const UChar *locname = NULL;
    TZGNCore *nonConstThis = const_cast<TZGNCore *>(this);
    umtx_lock(&gLock);
    {
        locname = nonConstThis->getGenericLocationName(tzCanonicalID);
    }
    umtx_unlock(&gLock);

    if (locname == NULL) {
        name.setToBogus();
    } else {
        name.setTo(locname, u_strlen(locname));
    }

    return name;
}